

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::getECPublicKey(SoftHSM *this,ECPublicKey *publicKey,Token *token,OSObject *key)

{
  Token *this_00;
  int iVar1;
  undefined1 in_CL;
  undefined1 uVar2;
  byte bVar3;
  undefined7 in_register_00000009;
  Token *in_RDX;
  long *in_RSI;
  uchar *in_R8;
  size_t in_R9;
  bool bOK;
  ByteString point;
  ByteString group;
  bool isKeyPrivate;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  ByteString *in_stack_fffffffffffffea0;
  byte local_152;
  undefined1 local_140 [40];
  undefined1 local_118 [40];
  undefined4 local_f0;
  byte local_e9;
  EVP_PKEY_CTX local_e8 [47];
  byte local_b9;
  EVP_PKEY_CTX local_b8 [43];
  byte local_8d;
  uchar local_80 [40];
  uchar local_58 [47];
  byte local_29;
  long *local_28;
  Token *local_20;
  long *local_18;
  CK_RV local_8;
  
  local_28 = (long *)CONCAT71(in_register_00000009,in_CL);
  if (in_RSI == (long *)0x0) {
    return 7;
  }
  if (in_RDX == (Token *)0x0) {
    return 7;
  }
  if (local_28 == (long *)0x0) {
    return 7;
  }
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_29 = (**(code **)(*local_28 + 0x20))(local_28,2,0);
  ByteString::ByteString((ByteString *)0x173087);
  ByteString::ByteString((ByteString *)0x173094);
  this_00 = local_20;
  if ((local_29 & 1) == 0) {
    (**(code **)(*local_28 + 0x30))(local_118,local_28,0x180);
    ByteString::operator=
              (in_stack_fffffffffffffea0,
               (ByteString *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    ByteString::~ByteString((ByteString *)0x1732db);
    (**(code **)(*local_28 + 0x30))(local_140,local_28,0x181);
    ByteString::operator=
              (in_stack_fffffffffffffea0,
               (ByteString *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    ByteString::~ByteString((ByteString *)0x173316);
  }
  else {
    local_8d = 1;
    uVar2 = 1;
    local_b9 = 0;
    (**(code **)(*local_28 + 0x30))(local_b8,local_28,0x180);
    local_b9 = 1;
    iVar1 = Token::decrypt(this_00,local_b8,local_58,(size_t *)CONCAT71(in_register_00000009,uVar2),
                           in_R8,in_R9);
    local_8d = (byte)iVar1 & 1;
    if ((local_b9 & 1) != 0) {
      ByteString::~ByteString((ByteString *)0x17314b);
    }
    local_e9 = 0;
    local_152 = 0;
    if ((local_8d & 1) != 0) {
      bVar3 = local_8d;
      (**(code **)(*local_28 + 0x30))(local_e8,local_28,0x181);
      local_e9 = 1;
      iVar1 = Token::decrypt(local_20,local_e8,local_80,
                             (size_t *)CONCAT71(in_register_00000009,bVar3),in_R8,in_R9);
      local_152 = (byte)iVar1;
    }
    local_8d = local_152 & 1;
    if ((local_e9 & 1) != 0) {
      ByteString::~ByteString((ByteString *)0x1731e1);
    }
    if ((local_8d & 1) == 0) {
      local_8 = 5;
      goto LAB_001733a5;
    }
  }
  (**(code **)(*local_18 + 0x38))(local_18,local_58);
  (**(code **)(*local_18 + 0x40))(local_18,local_80);
  local_8 = 0;
LAB_001733a5:
  local_f0 = 1;
  ByteString::~ByteString((ByteString *)0x1733b2);
  ByteString::~ByteString((ByteString *)0x1733bf);
  return local_8;
}

Assistant:

CK_RV SoftHSM::getECPublicKey(ECPublicKey* publicKey, Token* token, OSObject* key)
{
	if (publicKey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	// EC Public Key Attributes
	ByteString group;
	ByteString point;
	if (isKeyPrivate)
	{
		bool bOK = true;
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_EC_PARAMS), group);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_EC_POINT), point);
		if (!bOK)
			return CKR_GENERAL_ERROR;
	}
	else
	{
		group = key->getByteStringValue(CKA_EC_PARAMS);
		point = key->getByteStringValue(CKA_EC_POINT);
	}

	publicKey->setEC(group);
	publicKey->setQ(point);

	return CKR_OK;
}